

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O3

void ultag_close(ULanguageTag *langtag)

{
  VariantListEntry *pVVar1;
  ExtensionListEntry *pEVar2;
  VariantListEntry *buffer;
  ExtensionListEntry *buffer_00;
  
  if (langtag == (ULanguageTag *)0x0) {
    return;
  }
  uprv_free_63(langtag->buf);
  buffer = langtag->variants;
  while (buffer != (VariantListEntry *)0x0) {
    pVVar1 = buffer->next;
    uprv_free_63(buffer);
    buffer = pVVar1;
  }
  buffer_00 = langtag->extensions;
  while (buffer_00 != (ExtensionListEntry *)0x0) {
    pEVar2 = buffer_00->next;
    uprv_free_63(buffer_00);
    buffer_00 = pEVar2;
  }
  uprv_free_63(langtag);
  return;
}

Assistant:

static void
ultag_close(ULanguageTag* langtag) {

    if (langtag == NULL) {
        return;
    }

    uprv_free(langtag->buf);

    if (langtag->variants) {
        VariantListEntry *curVar = langtag->variants;
        while (curVar) {
            VariantListEntry *nextVar = curVar->next;
            uprv_free(curVar);
            curVar = nextVar;
        }
    }

    if (langtag->extensions) {
        ExtensionListEntry *curExt = langtag->extensions;
        while (curExt) {
            ExtensionListEntry *nextExt = curExt->next;
            uprv_free(curExt);
            curExt = nextExt;
        }
    }

    uprv_free(langtag);
}